

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wabtapi.cc
# Opt level: O0

void Validate(ChakraContext *ctx,bool isSpec)

{
  WabtAPIError *pWVar1;
  bool isSpec_local;
  ChakraContext *ctx_local;
  
  if (ctx->createBuffer == (CreateBufferFn)0x0) {
    pWVar1 = (WabtAPIError *)__cxa_allocate_exception(8);
    ChakraWabt::WabtAPIError::WabtAPIError(pWVar1,"Missing createBuffer");
    __cxa_throw(pWVar1,&ChakraWabt::WabtAPIError::typeinfo,0);
  }
  if (isSpec) {
    if (ctx->spec == (SpecContext *)0x0) {
      pWVar1 = (WabtAPIError *)__cxa_allocate_exception(8);
      ChakraWabt::WabtAPIError::WabtAPIError(pWVar1,"Missing Spec context");
      __cxa_throw(pWVar1,&ChakraWabt::WabtAPIError::typeinfo,0);
    }
    if (ctx->spec->setProperty == (SetPropertyFn)0x0) {
      pWVar1 = (WabtAPIError *)__cxa_allocate_exception(8);
      ChakraWabt::WabtAPIError::WabtAPIError(pWVar1,"Missing spec->setProperty");
      __cxa_throw(pWVar1,&ChakraWabt::WabtAPIError::typeinfo,0);
    }
    if (ctx->spec->int32ToVar == (Int32ToVarFn)0x0) {
      pWVar1 = (WabtAPIError *)__cxa_allocate_exception(8);
      ChakraWabt::WabtAPIError::WabtAPIError(pWVar1,"Missing spec->int32ToVar");
      __cxa_throw(pWVar1,&ChakraWabt::WabtAPIError::typeinfo,0);
    }
    if (ctx->spec->int64ToVar == (Int64ToVarFn)0x0) {
      pWVar1 = (WabtAPIError *)__cxa_allocate_exception(8);
      ChakraWabt::WabtAPIError::WabtAPIError(pWVar1,"Missing spec->int64ToVar");
      __cxa_throw(pWVar1,&ChakraWabt::WabtAPIError::typeinfo,0);
    }
    if (ctx->spec->stringToVar == (StringToVarFn)0x0) {
      pWVar1 = (WabtAPIError *)__cxa_allocate_exception(8);
      ChakraWabt::WabtAPIError::WabtAPIError(pWVar1,"Missing spec->stringToVar");
      __cxa_throw(pWVar1,&ChakraWabt::WabtAPIError::typeinfo,0);
    }
    if (ctx->spec->createObject == (CreateObjectFn)0x0) {
      pWVar1 = (WabtAPIError *)__cxa_allocate_exception(8);
      ChakraWabt::WabtAPIError::WabtAPIError(pWVar1,"Missing spec->createObject");
      __cxa_throw(pWVar1,&ChakraWabt::WabtAPIError::typeinfo,0);
    }
    if (ctx->spec->createArray == (CreateArrayFn)0x0) {
      pWVar1 = (WabtAPIError *)__cxa_allocate_exception(8);
      ChakraWabt::WabtAPIError::WabtAPIError(pWVar1,"Missing spec->createArray");
      __cxa_throw(pWVar1,&ChakraWabt::WabtAPIError::typeinfo,0);
    }
    if (ctx->spec->push == (PushFn)0x0) {
      pWVar1 = (WabtAPIError *)__cxa_allocate_exception(8);
      ChakraWabt::WabtAPIError::WabtAPIError(pWVar1,"Missing spec->push");
      __cxa_throw(pWVar1,&ChakraWabt::WabtAPIError::typeinfo,0);
    }
  }
  return;
}

Assistant:

void Validate(const ChakraContext& ctx, bool isSpec)
{
    if (!ctx.createBuffer) throw WabtAPIError("Missing createBuffer");
    if (isSpec)
    {
        if (!ctx.spec) throw WabtAPIError("Missing Spec context");
        if (!ctx.spec->setProperty) throw WabtAPIError("Missing spec->setProperty");
        if (!ctx.spec->int32ToVar) throw WabtAPIError("Missing spec->int32ToVar");
        if (!ctx.spec->int64ToVar) throw WabtAPIError("Missing spec->int64ToVar");
        if (!ctx.spec->stringToVar) throw WabtAPIError("Missing spec->stringToVar");
        if (!ctx.spec->createObject) throw WabtAPIError("Missing spec->createObject");
        if (!ctx.spec->createArray) throw WabtAPIError("Missing spec->createArray");
        if (!ctx.spec->push) throw WabtAPIError("Missing spec->push");
    }
}